

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_1c161f7::looksLikeSpecialVariable
          (anon_unknown_dwarf_1c161f7 *this,string *var,static_string_view prefix,size_t varNameLen)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  bool bVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_80;
  undefined8 local_70;
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_80._M_str = (char *)prefix.super_string_view._M_len;
  if (prefix.super_string_view._M_str < (char *)((long)&(var->_M_dataplus)._M_p + 3U)) {
    bVar4 = false;
  }
  else {
    pcVar1 = *(char **)this;
    sVar2 = *(size_t *)(this + 8);
    local_68 = local_50;
    local_60 = 1;
    local_50[0] = 0x7b;
    local_70 = 1;
    views._M_len = 2;
    views._M_array = &local_80;
    local_80._M_len = (size_t)var;
    local_58 = local_68;
    cmCatViews_abi_cxx11_(&local_a0,views);
    __str._M_str = local_a0._M_dataplus._M_p;
    __str._M_len = local_a0._M_string_length;
    local_80._M_len = sVar2;
    local_80._M_str = pcVar1;
    iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (&local_80,0,local_a0._M_string_length,__str);
    if (iVar3 == 0) {
      bVar4 = prefix.super_string_view._M_str[*(long *)this + -1] == '}';
    }
    else {
      bVar4 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  return bVar4;
}

Assistant:

bool looksLikeSpecialVariable(const std::string& var,
                              cm::static_string_view prefix,
                              const std::size_t varNameLen)
{
  // NOTE Expecting a variable name at least 1 char length:
  // <prefix> + `{` + <varname> + `}`
  return ((prefix.size() + 3) <= varNameLen) &&
    cmHasPrefix(var, cmStrCat(prefix, '{')) && var[varNameLen - 1] == '}';
}